

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall QMenuBarPrivate::_q_actionTriggered(QMenuBarPrivate *this)

{
  QAction *_t1;
  QMenuBarPrivate *in_RDI;
  QAction *action;
  QMenuBar *q;
  
  q_func(in_RDI);
  QObject::sender();
  _t1 = qobject_cast<QAction*>((QObject *)0x65b73e);
  if (_t1 != (QAction *)0x0) {
    QMenuBar::triggered((QMenuBar *)0x65b757,_t1);
  }
  return;
}

Assistant:

void QMenuBarPrivate::_q_actionTriggered()
{
    Q_Q(QMenuBar);
    if (QAction *action = qobject_cast<QAction *>(q->sender())) {
        emit q->triggered(action);
    }
}